

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,call_expression *e)

{
  bool bVar1;
  value_type vVar2;
  version vVar3;
  expression *member_00;
  __tuple_element_t<0UL,_tuple<value,_value>_> *v;
  expression_list *es;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  native_error_exception *this_00;
  global_object *this_01;
  object_ptr *p;
  string *this_02;
  source_extend *pos;
  wstring_view __x;
  undefined1 local_368 [8];
  auto_stack_update asu;
  value local_310;
  undefined1 local_2e8 [8];
  object_ptr o;
  reference *ref;
  wstring local_2c8 [6];
  bool is_es5_or_later;
  wstring_view local_2a8;
  wstring local_298;
  wstring_view local_278;
  string local_268;
  wstring_view local_258;
  wostringstream local_248 [8];
  wostringstream woss;
  undefined1 local_d0 [8];
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  undefined1 local_a8 [8];
  value mval;
  type *this_;
  type *member;
  call_expression *local_20;
  call_expression *e_local;
  impl *this_local;
  
  local_20 = e;
  e_local = (call_expression *)this;
  this_local = (impl *)__return_storage_ptr__;
  member_00 = call_expression::member(e);
  eval_call_member((tuple<mjs::value,_mjs::value> *)&member,this,member_00);
  v = std::get<0ul,mjs::value,mjs::value>((tuple<mjs::value,_mjs::value> *)&member);
  mval.field_1._24_8_ =
       std::get<1ul,mjs::value,mjs::value>((tuple<mjs::value,_mjs::value> *)&member);
  get_value((value *)local_a8,this,v);
  es = call_expression::arguments(local_20);
  eval_argument_list((vector<mjs::value,_std::allocator<mjs::value>_> *)local_d0,this,es);
  vVar2 = value::type((value *)local_a8);
  if (vVar2 == object) {
    this_01 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
    vVar3 = global_object::language_version(this_01);
    this->was_direct_call_to_eval_ = (bool)((1 < (int)vVar3 ^ 0xffU) & 1);
    vVar2 = value::type((value *)mval.field_1._24_8_);
    if ((vVar2 == undefined) && (vVar2 = value::type(v), vVar2 == reference)) {
      o.super_gc_heap_ptr_untyped._8_8_ = value::reference_value(v);
      p = reference::base((reference *)o.super_gc_heap_ptr_untyped._8_8_);
      gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_2e8,p);
      bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)local_2e8);
      if ((bVar1) &&
         ((bVar1 = gc_heap_ptr_untyped::has_type<mjs::activation_object>
                             ((gc_heap_ptr_untyped *)local_2e8), !bVar1 &&
          (bVar1 = is_global_object((object_ptr *)local_2e8), !bVar1)))) {
        value::value(&local_310,(object_ptr *)local_2e8);
        value::operator=((value *)mval.field_1._24_8_,&local_310);
        value::~value(&local_310);
      }
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_2e8);
      if (1 < (int)vVar3) {
        this_02 = reference::property_name((reference *)o.super_gc_heap_ptr_untyped._8_8_);
        __x = string::view(this_02);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&asu.pos_.start,L"eval"
                  );
        bVar1 = std::operator==(__x,stack0xfffffffffffffcd0);
        if (bVar1) {
          this->was_direct_call_to_eval_ = true;
        }
      }
    }
    pos = syntax_node::extend((syntax_node *)local_20);
    auto_stack_update::auto_stack_update((auto_stack_update *)local_368,this,pos);
    call_function(__return_storage_ptr__,(value *)local_a8,(value *)mval.field_1._24_8_,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)local_d0);
    auto_stack_update::~auto_stack_update((auto_stack_update *)local_368);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_d0);
    value::~value((value *)local_a8);
    std::tuple<mjs::value,_mjs::value>::~tuple((tuple<mjs::value,_mjs::value> *)&member);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream(local_248);
  to_string((mjs *)&local_268,this->heap_,(value *)local_a8);
  local_258 = string::view(&local_268);
  pbVar4 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_248,local_258
                          );
  std::operator<<(pbVar4," is not a function");
  string::~string(&local_268);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_298,this);
  local_278 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_298);
  std::__cxx11::wostringstream::str();
  local_2a8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_2c8);
  native_error_exception::native_error_exception(this_00,type,&local_278,&local_2a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value operator()(const call_expression& e) {
        // 11.2.3 The order of these two steps are actually reversed prior to ES5, but it's unlikely to be observable
        auto [member, this_] = eval_call_member(e.member());
        auto mval = get_value(member);
        auto args = eval_argument_list(e.arguments());
        if (mval.type() != value_type::object) {
            std::wostringstream woss;
            woss << to_string(heap_, mval).view() << " is not a function";
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
        // See ES5.1, 10.4.2 and 15.1.2.1.1
        const bool is_es5_or_later = global_->language_version() >= version::es5;
        was_direct_call_to_eval_ = !is_es5_or_later;
        if (this_.type() == value_type::undefined && member.type() == value_type::reference) {
            const auto& ref = member.reference_value();
            if (auto o = ref.base(); o && !o.has_type<activation_object>() && !is_global_object(o)) {
                this_ = value{o};
            }
            if (is_es5_or_later && ref.property_name().view() == L"eval") {
                // Meh, may need extra/better check
                was_direct_call_to_eval_ = true;
            }
        }

        auto_stack_update asu{*this, e.extend()};
        return call_function(mval, this_, args);
    }